

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

void __thiscall Minisat::SimpSolver::~SimpSolver(SimpSolver *this)

{
  Lit *__ptr;
  char *pcVar1;
  uint *puVar2;
  int *piVar3;
  
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__SimpSolver_00138c98;
  __ptr = (this->merge_count_cls).data;
  if (__ptr != (Lit *)0x0) {
    (this->merge_count_cls).sz = 0;
    free(__ptr);
    (this->merge_count_cls).data = (Lit *)0x0;
    (this->merge_count_cls).cap = 0;
  }
  pcVar1 = (this->eliminated).data;
  if (pcVar1 != (char *)0x0) {
    (this->eliminated).sz = 0;
    free(pcVar1);
    (this->eliminated).data = (char *)0x0;
    (this->eliminated).cap = 0;
  }
  pcVar1 = (this->frozen).data;
  if (pcVar1 != (char *)0x0) {
    (this->frozen).sz = 0;
    free(pcVar1);
    (this->frozen).data = (char *)0x0;
    (this->frozen).cap = 0;
  }
  puVar2 = (this->subsumption_queue).buf.data;
  if (puVar2 != (uint *)0x0) {
    (this->subsumption_queue).buf.sz = 0;
    free(puVar2);
    (this->subsumption_queue).buf.data = (uint *)0x0;
    (this->subsumption_queue).buf.cap = 0;
  }
  piVar3 = (this->elim_heap).indices.data;
  if (piVar3 != (int *)0x0) {
    (this->elim_heap).indices.sz = 0;
    free(piVar3);
    (this->elim_heap).indices.data = (int *)0x0;
    (this->elim_heap).indices.cap = 0;
  }
  piVar3 = (this->elim_heap).heap.data;
  if (piVar3 != (int *)0x0) {
    (this->elim_heap).heap.sz = 0;
    free(piVar3);
    (this->elim_heap).heap.data = (int *)0x0;
    (this->elim_heap).heap.cap = 0;
  }
  piVar3 = (this->n_occ).data;
  if (piVar3 != (int *)0x0) {
    (this->n_occ).sz = 0;
    free(piVar3);
    (this->n_occ).data = (int *)0x0;
    (this->n_occ).cap = 0;
  }
  piVar3 = (this->occurs).dirties.data;
  if (piVar3 != (int *)0x0) {
    (this->occurs).dirties.sz = 0;
    free(piVar3);
    (this->occurs).dirties.data = (int *)0x0;
    (this->occurs).dirties.cap = 0;
  }
  pcVar1 = (this->occurs).dirty.data;
  if (pcVar1 != (char *)0x0) {
    (this->occurs).dirty.sz = 0;
    free(pcVar1);
    (this->occurs).dirty.data = (char *)0x0;
    (this->occurs).dirty.cap = 0;
  }
  vec<Minisat::vec<unsigned_int>_>::clear(&(this->occurs).occs,true);
  pcVar1 = (this->touched).data;
  if (pcVar1 != (char *)0x0) {
    (this->touched).sz = 0;
    free(pcVar1);
    (this->touched).data = (char *)0x0;
    (this->touched).cap = 0;
  }
  puVar2 = (this->elimclauses).data;
  if (puVar2 != (uint *)0x0) {
    (this->elimclauses).sz = 0;
    free(puVar2);
    (this->elimclauses).data = (uint *)0x0;
    (this->elimclauses).cap = 0;
  }
  Solver::~Solver(&this->super_Solver);
  return;
}

Assistant:

Var SimpSolver::newVar(bool sign, bool dvar)
{
    Var v = Solver::newVar(sign, dvar);

    frozen.push((char)false);
    eliminated.push((char)false);

    if (use_simplification) {
        n_occ.push(0);
        n_occ.push(0);
        occurs.init(v);
        touched.push(0);
        elim_heap.insert(v);
    }

    // TODO: make sure to add new data structures also to reserveVars below!

    return v;
}